

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractDOMParser::setValidationScheme(AbstractDOMParser *this,ValSchemes newScheme)

{
  ValSchemes newScheme_local;
  AbstractDOMParser *this_local;
  
  if (newScheme == Val_Never) {
    XMLScanner::setValidationScheme(this->fScanner,Val_Never);
  }
  else if (newScheme == Val_Always) {
    XMLScanner::setValidationScheme(this->fScanner,Val_Always);
  }
  else {
    XMLScanner::setValidationScheme(this->fScanner,Val_Auto);
  }
  return;
}

Assistant:

void AbstractDOMParser::setValidationScheme(const ValSchemes newScheme)
{
    if (newScheme == Val_Never)
        fScanner->setValidationScheme(XMLScanner::Val_Never);
    else if (newScheme == Val_Always)
        fScanner->setValidationScheme(XMLScanner::Val_Always);
    else
        fScanner->setValidationScheme(XMLScanner::Val_Auto);
}